

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTextElement.cpp
# Opt level: O2

void __thiscall KDReports::TextElement::build(TextElement *this,ReportBuilder *builder)

{
  Int IVar1;
  long lVar2;
  int pos;
  QTextCursor *pQVar3;
  int weight;
  TextElementPrivate *pTVar4;
  initializer_list<QString> args;
  QTextCharFormat charFormat;
  QArrayDataPointer<QString> local_58;
  QArrayDataPointer<char16_t> local_40;
  
  pQVar3 = ReportBuilder::cursor(builder);
  pos = QTextCursor::position();
  QTextCursor::charFormat();
  cleanupVariableProperties(&charFormat);
  pTVar4 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (pTVar4->m_fontSet == true) {
    QTextCharFormat::setFont((QFont *)&charFormat,(int)pTVar4 + 0x70);
    pTVar4 = (this->d)._M_t.
             super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
             .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  }
  if (pTVar4->m_boldIsSet == true) {
    weight = 400;
    if (pTVar4->m_bold != false) {
      weight = 700;
    }
    QTextCharFormat::setFontWeight(&charFormat,weight);
    pTVar4 = (this->d)._M_t.
             super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
             .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  }
  if (pTVar4->m_italicIsSet == true) {
    QTextCharFormat::setFontItalic(&charFormat,pTVar4->m_italic);
    pTVar4 = (this->d)._M_t.
             super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
             .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  }
  if (pTVar4->m_underlineIsSet == true) {
    QTextCharFormat::setFontUnderline(&charFormat,pTVar4->m_underline);
    pTVar4 = (this->d)._M_t.
             super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
             .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  }
  if (pTVar4->m_strikeoutIsSet == true) {
    QTextCharFormat::setFontStrikeOut(&charFormat,pTVar4->m_strikeout);
    pTVar4 = (this->d)._M_t.
             super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
             .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  }
  if (0.0 < pTVar4->m_pointSize) {
    QTextCharFormat::setFontPointSize(&charFormat,pTVar4->m_pointSize);
    pTVar4 = (this->d)._M_t.
             super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
             .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  }
  lVar2 = (pTVar4->m_fontFamily).d.size;
  if (lVar2 != 0) {
    local_40.d = (pTVar4->m_fontFamily).d.d;
    local_40.ptr = (pTVar4->m_fontFamily).d.ptr;
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    args._M_len = 1;
    args._M_array = (iterator)&local_40;
    local_40.size = lVar2;
    QList<QString>::QList((QList<QString> *)&local_58,args);
    QTextCharFormat::setFontFamilies(&charFormat,(QStringList *)&local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    pTVar4 = (this->d)._M_t.
             super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
             .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  }
  if ((pTVar4->m_foreground).cspec == Invalid) {
    QTextFormat::clearForeground((QTextFormat *)&charFormat);
  }
  else {
    QBrush::QBrush((QBrush *)&local_58,&pTVar4->m_foreground,SolidPattern);
    QTextFormat::setForeground((QTextFormat *)&charFormat,(QBrush *)&local_58);
    QBrush::~QBrush((QBrush *)&local_58);
  }
  Element::background((Element *)&local_58);
  IVar1 = ((local_58.d)->super_QArrayData).flags.i;
  QBrush::~QBrush((QBrush *)&local_58);
  if (IVar1 == 0) {
    QTextFormat::clearBackground((QTextFormat *)&charFormat);
  }
  else {
    Element::background((Element *)&local_58);
    QTextFormat::setBackground((QTextFormat *)&charFormat,(QBrush *)&local_58);
    QBrush::~QBrush((QBrush *)&local_58);
  }
  QTextCursor::setCharFormat((QTextCharFormat *)pQVar3);
  QTextCursor::insertText((QString *)pQVar3);
  pTVar4 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::TextElementPrivate,_std::default_delete<KDReports::TextElementPrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::TextElementPrivate_*,_std::default_delete<KDReports::TextElementPrivate>_>
           .super__Head_base<0UL,_KDReports::TextElementPrivate_*,_false>._M_head_impl;
  if (*(qsizetype *)((long)&(pTVar4->m_id).d + 0x10) != 0) {
    TextDocumentData::setTextValueMarker
              (builder->m_contentDocument,pos,&pTVar4->m_id,
               *(int *)((long)&(pTVar4->m_string).d + 0x10),false);
  }
  QTextFormat::~QTextFormat((QTextFormat *)&charFormat);
  return;
}

Assistant:

void KDReports::TextElement::build(ReportBuilder &builder) const
{
    QTextCursor &cursor = builder.cursor();
    const int charPosition = cursor.position();
    QTextCharFormat charFormat = cursor.charFormat();
    KDReports::cleanupVariableProperties(charFormat);
    if (d->m_fontSet) {
#if QT_VERSION >= QT_VERSION_CHECK(5, 3, 0)
        charFormat.setFont(d->m_font, QTextCharFormat::FontPropertiesSpecifiedOnly);
#else
        charFormat.setFont(d->m_font);
#endif
    }
    if (d->m_boldIsSet)
        charFormat.setFontWeight(d->m_bold ? QFont::Bold : QFont::Normal);
    if (d->m_italicIsSet)
        charFormat.setFontItalic(d->m_italic);
    if (d->m_underlineIsSet)
        charFormat.setFontUnderline(d->m_underline);
    if (d->m_strikeoutIsSet)
        charFormat.setFontStrikeOut(d->m_strikeout);
    if (d->m_pointSize > 0)
        charFormat.setFontPointSize(d->m_pointSize);
    if (!d->m_fontFamily.isEmpty())
#if QT_VERSION >= QT_VERSION_CHECK(6, 1, 0)
        charFormat.setFontFamilies({d->m_fontFamily});
#else
        charFormat.setFontFamily(d->m_fontFamily);
#endif
    if (d->m_foreground.isValid())
        charFormat.setForeground(d->m_foreground);
    else
        charFormat.clearForeground();
    if (background().style() != Qt::NoBrush)
        charFormat.setBackground(background());
    else
        charFormat.clearBackground();
    cursor.setCharFormat(charFormat);
    cursor.insertText(d->m_string);
    if (!d->m_id.isEmpty())
        builder.currentDocumentData().setTextValueMarker(charPosition, d->m_id, d->m_string.length(), false);
}